

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

size_t argparse::details::
       get_levenshtein_distance<std::basic_string_view<char,std::char_traits<char>>>
                 (basic_string_view<char,_std::char_traits<char>_> *s1,
                 basic_string_view<char,_std::char_traits<char>_> *s2)

{
  long lVar1;
  size_t sVar2;
  pointer puVar3;
  unsigned_long uVar4;
  basic_string_view<char,_std::char_traits<char>_> *pbVar5;
  size_t i;
  ulong uVar6;
  size_t j;
  ulong uVar7;
  initializer_list<unsigned_long> __l;
  allocator_type local_72;
  allocator_type local_71;
  basic_string_view<char,_std::char_traits<char>_> *local_70;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  dp;
  value_type_conflict1 local_38;
  
  sVar2 = s1->_M_len;
  local_38 = 0;
  local_70 = s1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,s2->_M_len + 1,
             &local_38,&local_71);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&dp,sVar2 + 1,(value_type *)&local_68,&local_72);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_68);
  pbVar5 = local_70;
  for (uVar6 = 0; uVar6 <= pbVar5->_M_len; uVar6 = uVar6 + 1) {
    lVar1 = uVar6 - 1;
    for (uVar7 = 0; uVar7 <= s2->_M_len; uVar7 = uVar7 + 1) {
      if (uVar6 == 0) {
        ((dp.
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar7] = uVar7;
      }
      else if (uVar7 == 0) {
        *dp.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar6].
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start = uVar6;
      }
      else if (pbVar5->_M_str[lVar1] == s2->_M_str[uVar7 - 1]) {
        dp.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar6].
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] =
             dp.
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar1].
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7 - 1];
      }
      else {
        puVar3 = dp.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_68._M_impl.super__Vector_impl_data._M_start = (pointer)puVar3[uVar7];
        local_68._M_impl.super__Vector_impl_data._M_finish =
             (pointer)dp.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar6].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7 - 1];
        local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar3[uVar7 - 1];
        __l._M_len = 3;
        __l._M_array = (iterator)&local_68;
        uVar4 = std::min<unsigned_long>(__l);
        dp.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar6].
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] = uVar4 + 1;
        pbVar5 = local_70;
      }
    }
  }
  sVar2 = dp.
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[pbVar5->_M_len].
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[s2->_M_len];
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&dp);
  return sVar2;
}

Assistant:

std::size_t get_levenshtein_distance(const StringType &s1,
                                     const StringType &s2) {
  std::vector<std::vector<std::size_t>> dp(
      s1.size() + 1, std::vector<std::size_t>(s2.size() + 1, 0));

  for (std::size_t i = 0; i <= s1.size(); ++i) {
    for (std::size_t j = 0; j <= s2.size(); ++j) {
      if (i == 0) {
        dp[i][j] = j;
      } else if (j == 0) {
        dp[i][j] = i;
      } else if (s1[i - 1] == s2[j - 1]) {
        dp[i][j] = dp[i - 1][j - 1];
      } else {
        dp[i][j] = 1 + std::min({dp[i - 1][j], dp[i][j - 1], dp[i - 1][j - 1]});
      }
    }
  }

  return dp[s1.size()][s2.size()];
}